

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O2

Nullable<ZXing::Pdf417::Codeword> *
ZXing::Pdf417::DetectCodeword
          (Nullable<ZXing::Pdf417::Codeword> *__return_storage_ptr__,BitMatrix *image,int minColumn,
          int maxColumn,bool leftToRight,int startColumn,int imageRow,int minCodewordWidth,
          int maxCodewordWidth)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  undefined3 in_register_00000081;
  int i;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  value_type_conflict3 local_74;
  ModuleBitCountType moduleBitCount;
  ModuleBitCountType result;
  
  uVar8 = CONCAT31(in_register_00000081,leftToRight);
  uVar12 = -uVar8 | 1;
  iVar9 = 0;
  iVar10 = startColumn;
  uVar3 = uVar8;
LAB_00186c44:
  iVar11 = iVar10;
  if (iVar9 != 2) {
    uVar7 = startColumn - iVar10;
    do {
      if ((uVar3 & 1) == 0) {
        if (maxColumn <= iVar10) goto LAB_00186c92;
      }
      else if (iVar10 < minColumn) goto LAB_00186c92;
      bVar2 = BitMatrix::get(image,iVar10,imageRow);
      if (((bVar2 ^ (byte)uVar3) & 1) != 0) goto LAB_00186c92;
      uVar1 = -uVar7;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      iVar11 = startColumn;
      if (2 < uVar1) break;
      iVar10 = iVar10 + uVar12;
      uVar7 = uVar7 - uVar12;
    } while( true );
  }
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)moduleBitCount._M_elems + lVar5) = 0;
  }
  uVar6 = 0;
  iVar10 = iVar11;
  while( true ) {
    if (!leftToRight) {
      if (minColumn <= iVar10) goto joined_r0x00186cee;
      break;
    }
    if (maxColumn <= iVar10) break;
joined_r0x00186cee:
    if (7 < uVar6) break;
    bVar2 = BitMatrix::get(image,iVar10,imageRow);
    if (((bVar2 ^ (byte)uVar8) & 1) == 0) {
      moduleBitCount._M_elems[uVar6] = moduleBitCount._M_elems[uVar6] + 1;
      iVar10 = iVar10 + (leftToRight - 1 | 1);
    }
    else {
      uVar6 = uVar6 + 1;
      uVar8 = (uint)(byte)((byte)uVar8 ^ 1);
    }
  }
  if (uVar6 == 8) {
LAB_00186d44:
    iVar10 = Reduce<std::array<int,8ul>,int,std::plus<int>>(&moduleBitCount,0);
    if (leftToRight) {
      iVar9 = iVar11;
      iVar11 = iVar10 + iVar11;
    }
    else {
      std::__reverse<int*>(&moduleBitCount,&result);
      iVar9 = iVar11 - iVar10;
    }
    if (((minCodewordWidth + -2 <= iVar10 && iVar10 <= maxCodewordWidth + 2) &&
        (uVar3 = CodewordDecoder::GetDecodedValue(&moduleBitCount), uVar3 != 0xffffffff)) &&
       (iVar10 = CodewordDecoder::GetCodeword(uVar3), iVar10 != -1)) {
      local_74 = 0;
      std::array<int,_8UL>::fill(&result,&local_74);
      iVar4 = 7;
      uVar8 = 0;
      do {
        if ((uVar3 & 1) != uVar8) {
          if (iVar4 < 1) {
            __return_storage_ptr__->m_hasValue = true;
            (__return_storage_ptr__->m_value)._startX = iVar9;
            (__return_storage_ptr__->m_value)._endX = iVar11;
            (__return_storage_ptr__->m_value)._bucket =
                 (((result._M_elems[0] + result._M_elems[4]) -
                  (result._M_elems[2] + result._M_elems[6])) + 9) % 9;
            (__return_storage_ptr__->m_value)._value = iVar10;
            goto LAB_00186dfc;
          }
          iVar4 = iVar4 + -1;
          uVar8 = uVar3 & 1;
        }
        result._M_elems[iVar4] = result._M_elems[iVar4] + 1;
        uVar3 = (int)uVar3 >> 1;
      } while( true );
    }
  }
  else {
    if (leftToRight) {
      minColumn = maxColumn;
    }
    if (minColumn == iVar10 && uVar6 == 7) goto LAB_00186d44;
  }
  __return_storage_ptr__->m_hasValue = false;
  (__return_storage_ptr__->m_value)._startX = 0;
  (__return_storage_ptr__->m_value)._endX = 0;
  (__return_storage_ptr__->m_value)._bucket = 0;
  (__return_storage_ptr__->m_value)._value = 0;
LAB_00186dfc:
  (__return_storage_ptr__->m_value)._rowNumber = -1;
  return __return_storage_ptr__;
LAB_00186c92:
  uVar12 = -uVar12;
  uVar3 = uVar3 ^ 1;
  iVar9 = iVar9 + 1;
  goto LAB_00186c44;
}

Assistant:

static Nullable<Codeword> DetectCodeword(const BitMatrix& image, int minColumn, int maxColumn, bool leftToRight, int startColumn, int imageRow, int minCodewordWidth, int maxCodewordWidth)
{
	startColumn = AdjustCodewordStartColumn(image, minColumn, maxColumn, leftToRight, startColumn, imageRow);
	// we usually know fairly exact now how long a codeword is. We should provide minimum and maximum expected length
	// and try to adjust the read pixels, e.g. remove single pixel errors or try to cut off exceeding pixels.
	// min and maxCodewordWidth should not be used as they are calculated for the whole barcode an can be inaccurate
	// for the current position
	ModuleBitCountType moduleBitCount;
	if (!GetModuleBitCount(image, minColumn, maxColumn, leftToRight, startColumn, imageRow, moduleBitCount)) {
		return nullptr;
	}
	int endColumn;
	int codewordBitCount = Reduce(moduleBitCount);
	if (leftToRight) {
		endColumn = startColumn + codewordBitCount;
	}
	else {
		std::reverse(moduleBitCount.begin(), moduleBitCount.end());
		endColumn = startColumn;
		startColumn = endColumn - codewordBitCount;
	}
	// TODO implement check for width and correction of black and white bars
	// use start (and maybe stop pattern) to determine if blackbars are wider than white bars. If so, adjust.
	// should probably done only for codewords with a lot more than 17 bits. 
	// The following fixes 10-1.png, which has wide black bars and small white bars
	//    for (int i = 0; i < moduleBitCount.length; i++) {
	//      if (i % 2 == 0) {
	//        moduleBitCount[i]--;
	//      } else {
	//        moduleBitCount[i]++;
	//      }
	//    }

	// We could also use the width of surrounding codewords for more accurate results, but this seems
	// sufficient for now
	if (!CheckCodewordSkew(codewordBitCount, minCodewordWidth, maxCodewordWidth)) {
		// We could try to use the startX and endX position of the codeword in the same column in the previous row,
		// create the bit count from it and normalize it to 8. This would help with single pixel errors.
		return nullptr;
	}

	int decodedValue = CodewordDecoder::GetDecodedValue(moduleBitCount);
	if (decodedValue != -1) {
		int codeword = CodewordDecoder::GetCodeword(decodedValue);
		if (codeword != -1) {
			return Codeword(startColumn, endColumn, GetCodewordBucketNumber(decodedValue), codeword);
		}
	}
	return nullptr;
}